

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

void __thiscall
google::
sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::advance_past_deleted
          (sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar4;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *psVar5;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *psVar6;
  pointer ppVar7;
  size_type sVar8;
  bool bVar9;
  bool bVar10;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *psVar11;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *psVar12;
  pointer ppVar13;
  
  psVar4 = this->ht;
  psVar5 = (this->pos).row_end._M_current;
  psVar6 = (this->end).row_current._M_current;
  ppVar7 = (this->end).col_current;
  psVar12 = (this->pos).row_current._M_current;
  ppVar13 = (this->pos).col_current;
  bVar9 = (this->end).row_end._M_current != psVar5;
  bVar10 = (this->pos).row_begin._M_current != (this->end).row_begin._M_current;
  if (((bVar9 || bVar10) || (psVar12 != psVar6)) || (psVar6 != psVar5 && ppVar13 != ppVar7)) {
    sVar8 = psVar4->num_deleted;
    do {
      if (sVar8 == 0) {
        return;
      }
      iVar2 = (psVar4->key_info).delkey;
      iVar3 = ppVar13->first;
      piVar1 = &(psVar4->key_info).super_Hasher.num_compares_;
      *piVar1 = *piVar1 + 1;
      if (iVar2 != iVar3) {
        return;
      }
      ppVar13 = ppVar13 + 1;
      (this->pos).col_current = ppVar13;
      if (ppVar13 == psVar12->group + (psVar12->settings).num_buckets) {
        psVar12 = psVar12 + 1;
        if (psVar12 != psVar5) {
          do {
            psVar11 = psVar12;
            psVar12 = psVar11;
            if ((psVar11->settings).num_buckets != 0) break;
            psVar12 = psVar11 + 1;
          } while (psVar12 != psVar5);
          ppVar13 = psVar11->group;
          (this->pos).col_current = ppVar13;
        }
        (this->pos).row_current._M_current = psVar12;
      }
    } while ((psVar12 != psVar6 || (bVar9 || bVar10)) || (psVar6 != psVar5 && ppVar13 != ppVar7));
  }
  return;
}

Assistant:

void advance_past_deleted() {
    while (pos != end && ht->test_deleted(*this)) ++pos;
  }